

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.h
# Opt level: O1

void __thiscall imrt::ApertureILS::~ApertureILS(ApertureILS *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_ILS)._vptr_ILS = (_func_int **)&PTR__ApertureILS_0013cc30;
  p_Var2 = (this->tabu).
           super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->tabu) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~ApertureILS() {}